

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_request_state(connectdata *conn,_Bool *done)

{
  curl_off_t *pcVar1;
  _Bool _Var2;
  undefined2 uVar3;
  int *piVar4;
  char *pcVar5;
  char *__s;
  Curl_easy *pCVar6;
  curl_off_t cVar7;
  long lVar8;
  void *pvVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  CURLcode CVar12;
  CURLcode CVar13;
  __pid_t _Var14;
  size_t sVar15;
  size_t sVar16;
  int iVar17;
  size_t sVar18;
  uchar cmd;
  long lVar19;
  ulong len;
  uint uVar20;
  short sVar21;
  bool bVar22;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_478;
  void *local_470;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined2 uStack_465;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 uStack_460;
  short sStack_45f;
  undefined2 uStack_45d;
  char acStack_45b [2];
  uint uStack_459;
  char acStack_455 [2];
  undefined4 local_453;
  undefined2 uStack_44f;
  char acStack_448 [4];
  int iStack_444;
  short sStack_437;
  char acStack_435 [1029];
  
  piVar4 = (int *)(conn->data->req).protop;
  local_478 = (void *)0x0;
  if (*piVar4 == 0) {
    pcVar5 = (conn->host).name;
    sVar15 = strlen(pcVar5);
    __s = (conn->proto).ftpc.pp.linestart_resp;
    sVar16 = strlen(__s);
    CVar12 = CURLE_FILESIZE_EXCEEDED;
    if (0xfffffffffffffbfe < (sVar16 + sVar15) - 0x3f7) {
      memset(&local_468,0,0x40b);
      local_468 = 4;
      uStack_467 = 0xff;
      uStack_461 = 0;
      uStack_460 = 0;
      uStack_45d = 0x5c5c;
      acStack_45b[0] = '\0';
      strcpy(acStack_45b,pcVar5);
      sVar15 = strlen(pcVar5);
      (acStack_45b + sVar15)[0] = '\\';
      (acStack_45b + sVar15)[1] = '\0';
      strcpy(acStack_45b + sVar15 + 1,__s);
      sVar16 = strlen(__s);
      builtin_strncpy(acStack_455 + sVar16 + sVar15 + -4,"?????",6);
      sStack_45f = (short)(acStack_45b + ((sVar16 + sVar15) - (long)&uStack_45d) + 1) + 7;
      CVar12 = smb_send_message(conn,'u',&local_468,
                                (size_t)(acStack_45b + ((sVar16 + sVar15) - (long)&uStack_45d) + 1 +
                                        0x12));
    }
    if (CVar12 != CURLE_OK) goto LAB_0044d000;
    *(undefined4 *)(conn->data->req).protop = 1;
  }
  CVar12 = smb_send_and_recv(conn,&local_478);
  pvVar9 = local_478;
  if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
LAB_0044d000:
    Curl_conncontrol(conn,1);
    return CVar12;
  }
  CVar12 = CURLE_OK;
  if (local_478 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(*piVar4) {
  case 1:
    if (*(int *)((long)local_478 + 9) == 0) {
      *(undefined2 *)(piVar4 + 4) = *(undefined2 *)((long)local_478 + 0x1c);
      (conn->proto).ftpc.pp.response_time = 0;
      uVar20 = 2;
      pCVar6 = conn->data;
      pvVar9 = (pCVar6->req).protop;
      sVar15 = strlen(*(char **)((long)pvVar9 + 8));
      CVar13 = CURLE_FILESIZE_EXCEEDED;
      if (0xfffffffffffffbfe < sVar15 - 0x400) {
        memset(&local_468,0,0x433);
        local_468 = 0x18;
        uStack_467 = 0xff;
        pcVar5 = *(char **)((long)pvVar9 + 8);
        sVar15 = strlen(pcVar5);
        uStack_462 = (undefined1)sVar15;
        uStack_461 = (undefined1)(sVar15 >> 8);
        acStack_448[0] = '\a';
        acStack_448[1] = '\0';
        acStack_448[2] = '\0';
        acStack_448[3] = '\0';
        _Var2 = (pCVar6->set).upload;
        acStack_455[0] = (_Var2 - 2U) * '@';
        iStack_444 = (uint)_Var2 * 4 + 1;
        uStack_459 = (uint)(byte)uStack_459;
        sStack_437 = (short)sVar15 + 1;
        strcpy(acStack_435,pcVar5);
        CVar13 = smb_send_message(conn,0xa2,&local_468,sVar15 + 0x34);
      }
      goto LAB_0044d67a;
    }
    iVar17 = 0x4e;
    if (*(int *)((long)local_478 + 9) == 0x50001) {
      iVar17 = 9;
    }
    piVar4[5] = iVar17;
    (conn->proto).ftpc.pp.response_time = 0;
    break;
  case 2:
    if ((*(int *)((long)local_478 + 9) == 0) && (99 < (ulong)(conn->proto).ftpc.pp.response_time)) {
      *(undefined2 *)((long)piVar4 + 0x12) = *(undefined2 *)((long)local_478 + 0x2a);
      pCVar6 = conn->data;
      (pCVar6->req).offset = 0;
      if ((pCVar6->set).upload == true) {
        cVar7 = (pCVar6->state).infilesize;
        (pCVar6->req).size = cVar7;
        Curl_pgrsSetUploadSize(pCVar6,cVar7);
        uVar20 = 4;
        (conn->proto).ftpc.pp.response_time = 0;
switchD_0044d23e_caseD_1:
        pCVar6 = conn->data;
        local_470 = (pCVar6->req).protop;
        cVar7 = (pCVar6->req).offset;
        lVar19 = (pCVar6->req).size;
        lVar8 = (pCVar6->req).bytecount;
        CVar13 = Curl_get_upload_buffer(pCVar6);
        if (CVar13 == CURLE_OK) {
          sVar18 = lVar19 - lVar8;
          pcVar5 = (conn->data->state).ulbuf;
          if (0x7ffe < (long)sVar18) {
            sVar18 = 0x7fff;
          }
          pcVar5[0x20] = '\0';
          pcVar5[0x21] = '\0';
          pcVar5[0x22] = '\0';
          pcVar5[0x23] = '\0';
          pcVar5[0x24] = '\0';
          pcVar5[0x25] = '\0';
          pcVar5[0x26] = '\0';
          pcVar5[0x27] = '\0';
          pcVar5[0x28] = '\0';
          pcVar5[0x29] = '\0';
          pcVar5[0x2a] = '\0';
          pcVar5[0x2b] = '\0';
          pcVar5[0x2c] = '\0';
          pcVar5[0x2d] = '\0';
          pcVar5[0x2e] = '\0';
          pcVar5[0x2f] = '\0';
          pcVar5[0x40] = '\0';
          pcVar5[0x41] = '\0';
          pcVar5[0x42] = '\0';
          pcVar5[0x43] = '\0';
          pcVar5[0x30] = '\0';
          pcVar5[0x31] = '\0';
          pcVar5[0x32] = '\0';
          pcVar5[0x33] = '\0';
          pcVar5[0x34] = '\0';
          pcVar5[0x35] = '\0';
          pcVar5[0x36] = '\0';
          pcVar5[0x37] = '\0';
          pcVar5[0x38] = '\0';
          pcVar5[0x39] = '\0';
          pcVar5[0x3a] = '\0';
          pcVar5[0x3b] = '\0';
          pcVar5[0x3c] = '\0';
          pcVar5[0x3d] = '\0';
          pcVar5[0x3e] = '\0';
          pcVar5[0x3f] = '\0';
          pcVar5[0x10] = '\0';
          pcVar5[0x11] = '\0';
          pcVar5[0x12] = '\0';
          pcVar5[0x13] = '\0';
          pcVar5[0x14] = '\0';
          pcVar5[0x15] = '\0';
          pcVar5[0x16] = '\0';
          pcVar5[0x17] = '\0';
          pcVar5[0x18] = '\0';
          pcVar5[0x19] = '\0';
          pcVar5[0x1a] = '\0';
          pcVar5[0x1b] = '\0';
          pcVar5[0x1c] = '\0';
          pcVar5[0x1d] = '\0';
          pcVar5[0x1e] = '\0';
          pcVar5[0x1f] = '\0';
          pcVar5[0] = '\0';
          pcVar5[1] = '\0';
          pcVar5[2] = '\0';
          pcVar5[3] = '\0';
          pcVar5[4] = '\0';
          pcVar5[5] = '\0';
          pcVar5[6] = '\0';
          pcVar5[7] = '\0';
          pcVar5[8] = '\0';
          pcVar5[9] = '\0';
          pcVar5[10] = '\0';
          pcVar5[0xb] = '\0';
          pcVar5[0xc] = '\0';
          pcVar5[0xd] = '\0';
          pcVar5[0xe] = '\0';
          pcVar5[0xf] = '\0';
          pcVar5[0x24] = '\x0e';
          pcVar5[0x25] = -1;
          *(undefined2 *)(pcVar5 + 0x29) = *(undefined2 *)((long)local_470 + 0x12);
          *(int *)(pcVar5 + 0x2b) = (int)cVar7;
          *(int *)(pcVar5 + 0x3d) = (int)((ulong)cVar7 >> 0x20);
          sVar21 = (short)sVar18;
          *(short *)(pcVar5 + 0x39) = sVar21;
          pcVar5[0x3b] = '@';
          pcVar5[0x3c] = '\0';
          *(short *)(pcVar5 + 0x41) = sVar21 + 1;
          pvVar9 = (conn->data->req).protop;
          pcVar5[0] = '\0';
          pcVar5[1] = '\0';
          pcVar5[2] = '\0';
          pcVar5[3] = '\0';
          pcVar5[4] = '\0';
          pcVar5[5] = '\0';
          pcVar5[6] = '\0';
          pcVar5[7] = '\0';
          pcVar5[8] = '\0';
          pcVar5[9] = '\0';
          pcVar5[10] = '\0';
          pcVar5[0xb] = '\0';
          pcVar5[0xc] = '\0';
          pcVar5[0xd] = '\0';
          pcVar5[0xe] = '\0';
          pcVar5[0xf] = '\0';
          pcVar5[0x20] = '\0';
          pcVar5[0x21] = '\0';
          pcVar5[0x22] = '\0';
          pcVar5[0x23] = '\0';
          pcVar5[0x10] = '\0';
          pcVar5[0x11] = '\0';
          pcVar5[0x12] = '\0';
          pcVar5[0x13] = '\0';
          pcVar5[0x14] = '\0';
          pcVar5[0x15] = '\0';
          pcVar5[0x16] = '\0';
          pcVar5[0x17] = '\0';
          pcVar5[0x18] = '\0';
          pcVar5[0x19] = '\0';
          pcVar5[0x1a] = '\0';
          pcVar5[0x1b] = '\0';
          pcVar5[0x1c] = '\0';
          pcVar5[0x1d] = '\0';
          pcVar5[0x1e] = '\0';
          pcVar5[0x1f] = '\0';
          *(ushort *)(pcVar5 + 2) = (sVar21 + 0x40U) * 0x100 | (ushort)(sVar21 + 0x40U) >> 8;
          pcVar5[4] = -1;
          pcVar5[5] = 'S';
          pcVar5[6] = 'M';
          pcVar5[7] = 'B';
          pcVar5[8] = '/';
          pcVar5[0xd] = '\x18';
          pcVar5[0xe] = 'A';
          pcVar5[0xf] = '\0';
          *(unsigned_short *)(pcVar5 + 0x20) = (conn->proto).smbc.uid;
          *(undefined2 *)(pcVar5 + 0x1c) = *(undefined2 *)((long)pvVar9 + 0x10);
          _Var14 = getpid();
          *(short *)(pcVar5 + 0x10) = (short)((uint)_Var14 >> 0x10);
          *(short *)(pcVar5 + 0x1e) = (short)_Var14;
          CVar13 = smb_send(conn,0x44,sVar18);
        }
        goto LAB_0044d67a;
      }
      lVar19 = *(long *)((long)local_478 + 0x5c);
      (pCVar6->req).size = lVar19;
      if (lVar19 < 0) {
        piVar4[5] = 8;
        uVar20 = 5;
        (conn->proto).ftpc.pp.response_time = 0;
        goto switchD_0044d23e_caseD_0;
      }
      Curl_pgrsSetDownloadSize(pCVar6,lVar19);
      iVar17 = 3;
      if ((conn->data->set).get_filetime != true) goto LAB_0044d032;
      (conn->data->info).filetime = (*(long *)((long)pvVar9 + 0x48) + -0x19db1ded53e8000) / 10000000
      ;
      uVar20 = 3;
      (conn->proto).ftpc.pp.response_time = 0;
switchD_0044d3bd_caseD_0:
      cVar7 = (conn->data->req).offset;
      uStack_466 = 0;
      uStack_465 = 0;
      uStack_459 = 0;
      acStack_455[0] = '\0';
      acStack_455[1] = 0;
      uStack_44f = 0;
      local_468 = 0xc;
      uStack_467 = 0xff;
      uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x12);
      uStack_463 = (undefined1)uVar3;
      uStack_462 = (undefined1)((ushort)uVar3 >> 8);
      uStack_461 = (undefined1)cVar7;
      uStack_460 = (undefined1)((ulong)cVar7 >> 8);
      sStack_45f = (short)((ulong)cVar7 >> 0x10);
      local_453 = (undefined4)((ulong)cVar7 >> 0x20);
      uStack_45d = 0x8000;
      acStack_45b[0] = '\0';
      acStack_45b[1] = 0x80;
      sVar18 = 0x1b;
      cmd = '.';
    }
    else {
      piVar4[5] = 0x4e;
      uVar20 = 6;
      (conn->proto).ftpc.pp.response_time = 0;
      uStack_466 = 0;
      local_468 = 0;
      uStack_467 = 0;
      sVar18 = 3;
      cmd = 'q';
    }
    goto LAB_0044d667;
  case 3:
    if ((*(int *)((long)local_478 + 9) == 0) && (0x31 < (ulong)(conn->proto).ftpc.pp.response_time))
    {
      uVar11 = Curl_read16_le((uchar *)((long)local_478 + 0x2f));
      uVar10 = Curl_read16_le((uchar *)((long)pvVar9 + 0x31));
      len = (ulong)uVar11;
      if (uVar11 != 0) {
        if ((ulong)(conn->proto).ftpc.pp.response_time < len + uVar10 + 4) {
          Curl_failf(conn->data,"Invalid input packet");
          CVar13 = CURLE_RECV_ERROR;
        }
        else {
          CVar13 = Curl_client_write(conn,1,(char *)((long)pvVar9 + (ulong)uVar10 + 4),len);
        }
        if (CVar13 != CURLE_OK) {
          piVar4[5] = CVar13;
          uVar20 = 5;
          (conn->proto).ftpc.pp.response_time = 0;
          goto switchD_0044d23e_caseD_0;
        }
      }
      pCVar6 = conn->data;
      lVar19 = (pCVar6->req).bytecount + len;
      (pCVar6->req).bytecount = lVar19;
      pcVar1 = &(pCVar6->req).offset;
      *pcVar1 = *pcVar1 + len;
      Curl_pgrsSetDownloadCounter(pCVar6,lVar19);
      bVar22 = -1 < (short)uVar11;
      uVar20 = bVar22 + 3 + (uint)bVar22;
      (conn->proto).ftpc.pp.response_time = 0;
      switch(bVar22) {
      case false:
        goto switchD_0044d3bd_caseD_0;
      }
    }
    else {
      piVar4[5] = 0x38;
      uVar20 = 5;
      (conn->proto).ftpc.pp.response_time = 0;
    }
    goto switchD_0044d23e_caseD_0;
  case 4:
    if ((*(int *)((long)local_478 + 9) == 0) && (0x29 < (ulong)(conn->proto).ftpc.pp.response_time))
    {
      uVar11 = Curl_read16_le((uchar *)((long)local_478 + 0x29));
      pCVar6 = conn->data;
      lVar19 = (pCVar6->req).bytecount + (ulong)uVar11;
      (pCVar6->req).bytecount = lVar19;
      pcVar1 = &(pCVar6->req).offset;
      *pcVar1 = *pcVar1 + (ulong)uVar11;
      Curl_pgrsSetUploadCounter(pCVar6,lVar19);
      bVar22 = (conn->data->req).bytecount < (conn->data->req).size;
      uVar20 = bVar22 ^ 5;
      (conn->proto).ftpc.pp.response_time = 0;
      switch(bVar22) {
      case true:
        goto switchD_0044d23e_caseD_1;
      }
    }
    else {
      piVar4[5] = 0x19;
      uVar20 = 5;
      (conn->proto).ftpc.pp.response_time = 0;
    }
switchD_0044d23e_caseD_0:
    uStack_465 = 0;
    uStack_463 = 0;
    uStack_462 = 0;
    uStack_461 = 0;
    uStack_460 = 0;
    local_468 = 3;
    uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x12);
    uStack_467 = (undefined1)uVar3;
    uStack_466 = (undefined1)((ushort)uVar3 >> 8);
    sVar18 = 9;
    cmd = '\x04';
LAB_0044d667:
    CVar13 = smb_send_message(conn,cmd,&local_468,sVar18);
    goto LAB_0044d67a;
  case 5:
    iVar17 = 6;
LAB_0044d032:
    (conn->proto).ftpc.pp.response_time = 0;
    CVar12 = (*(code *)((long)&DAT_004e5534 + (long)(int)(&DAT_004e5534)[iVar17 - 2]))();
    return CVar12;
  case 6:
    (conn->proto).ftpc.pp.response_time = 0;
    break;
  default:
    (conn->proto).ftpc.pp.response_time = 0;
    return CURLE_OK;
  }
  uVar20 = 7;
  CVar13 = piVar4[5];
  *done = true;
LAB_0044d67a:
  if (CVar13 == CURLE_OK) {
    *(uint *)(conn->data->req).protop = uVar20;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar12 = CVar13;
  }
  return CVar12;
}

Assistant:

static CURLcode smb_request_state(struct connectdata *conn, bool *done)
{
  struct smb_request *req = conn->data->req.protop;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(conn);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(conn, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    conn->data->req.offset = 0;
    if(conn->data->set.upload) {
      conn->data->req.size = conn->data->state.infilesize;
      Curl_pgrsSetUploadSize(conn->data, conn->data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      smb_m = (const struct smb_nt_create_response*) msg;
      conn->data->req.size = smb_swap64(smb_m->end_of_file);
      if(conn->data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(conn->data, conn->data->req.size);
        if(conn->data->set.get_filetime)
          get_posix_time(&conn->data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(conn->data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetDownloadCounter(conn->data, conn->data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetUploadCounter(conn->data, conn->data->req.bytecount);
    if(conn->data->req.bytecount >= conn->data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(conn);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(conn);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(conn);
    break;

  case SMB_CLOSE:
    result = smb_send_close(conn);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(conn);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(conn, next_state);

  return CURLE_OK;
}